

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParserHandlePEReference(xmlParserCtxtPtr ctxt)

{
  ulong uVar1;
  xmlParserErrors error;
  
  switch(ctxt->instate) {
  case XML_PARSER_START:
  case XML_PARSER_MISC:
  case XML_PARSER_PROLOG:
    error = XML_ERR_PEREF_IN_PROLOG;
    break;
  case XML_PARSER_PI:
  case XML_PARSER_COMMENT:
  case XML_PARSER_START_TAG:
  case XML_PARSER_CONTENT:
  case XML_PARSER_CDATA_SECTION:
  case XML_PARSER_END_TAG:
  case XML_PARSER_ENTITY_DECL:
  case XML_PARSER_ENTITY_VALUE:
  case XML_PARSER_ATTRIBUTE_VALUE:
  case XML_PARSER_SYSTEM_LITERAL:
  case XML_PARSER_IGNORE:
  case XML_PARSER_PUBLIC_LITERAL:
    return;
  case XML_PARSER_DTD:
    if ((ctxt->external == 0) && (ctxt->inputNr == 1)) {
      return;
    }
    uVar1 = (ulong)ctxt->input->cur[1];
    if ((uVar1 < 0x21) && ((0x100002601U >> (uVar1 & 0x3f) & 1) != 0)) {
      return;
    }
  default:
    xmlParsePEReference(ctxt);
    return;
  case XML_PARSER_EPILOG:
    error = XML_ERR_PEREF_IN_EPILOG;
    break;
  case XML_PARSER_EOF:
    error = XML_ERR_PEREF_AT_EOF;
  }
  xmlFatalErr(ctxt,error,(char *)0x0);
  return;
}

Assistant:

void
xmlParserHandlePEReference(xmlParserCtxtPtr ctxt) {
    switch(ctxt->instate) {
	case XML_PARSER_CDATA_SECTION:
	    return;
        case XML_PARSER_COMMENT:
	    return;
	case XML_PARSER_START_TAG:
	    return;
	case XML_PARSER_END_TAG:
	    return;
        case XML_PARSER_EOF:
	    xmlFatalErr(ctxt, XML_ERR_PEREF_AT_EOF, NULL);
	    return;
        case XML_PARSER_PROLOG:
	case XML_PARSER_START:
	case XML_PARSER_MISC:
	    xmlFatalErr(ctxt, XML_ERR_PEREF_IN_PROLOG, NULL);
	    return;
	case XML_PARSER_ENTITY_DECL:
        case XML_PARSER_CONTENT:
        case XML_PARSER_ATTRIBUTE_VALUE:
        case XML_PARSER_PI:
	case XML_PARSER_SYSTEM_LITERAL:
	case XML_PARSER_PUBLIC_LITERAL:
	    /* we just ignore it there */
	    return;
        case XML_PARSER_EPILOG:
	    xmlFatalErr(ctxt, XML_ERR_PEREF_IN_EPILOG, NULL);
	    return;
	case XML_PARSER_ENTITY_VALUE:
	    /*
	     * NOTE: in the case of entity values, we don't do the
	     *       substitution here since we need the literal
	     *       entity value to be able to save the internal
	     *       subset of the document.
	     *       This will be handled by xmlStringDecodeEntities
	     */
	    return;
        case XML_PARSER_DTD:
	    /*
	     * [WFC: Well-Formedness Constraint: PEs in Internal Subset]
	     * In the internal DTD subset, parameter-entity references
	     * can occur only where markup declarations can occur, not
	     * within markup declarations.
	     * In that case this is handled in xmlParseMarkupDecl
	     */
	    if ((ctxt->external == 0) && (ctxt->inputNr == 1))
		return;
	    if (IS_BLANK_CH(NXT(1)) || NXT(1) == 0)
		return;
            break;
        case XML_PARSER_IGNORE:
            return;
    }

    xmlParsePEReference(ctxt);
}